

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O0

bool CorUnix::CPalSynchronizationManager::InterlockedAwaken(DWORD *pWaitState,bool fAlertOnly)

{
  LONG LVar1;
  DWORD dwPrevState;
  bool fAlertOnly_local;
  DWORD *pWaitState_local;
  
  LVar1 = InterlockedCompareExchange((LONG *)pWaitState,0,2);
  if (LVar1 == 2) {
    pWaitState_local._7_1_ = true;
  }
  else if (fAlertOnly) {
    pWaitState_local._7_1_ = false;
  }
  else {
    LVar1 = InterlockedCompareExchange((LONG *)pWaitState,0,1);
    if (LVar1 == 1) {
      pWaitState_local._7_1_ = true;
    }
    else {
      pWaitState_local._7_1_ = false;
    }
  }
  return pWaitState_local._7_1_;
}

Assistant:

bool CPalSynchronizationManager::InterlockedAwaken(
        DWORD *pWaitState,
        bool fAlertOnly)
    {
        DWORD dwPrevState;

        dwPrevState = InterlockedCompareExchange((LONG *)pWaitState,
                                                 TWS_ACTIVE, TWS_ALERTABLE);
        if(TWS_ALERTABLE != dwPrevState)
        {
            if(fAlertOnly)
            {
                return false;
            }

            dwPrevState = InterlockedCompareExchange((LONG *)pWaitState,
                                                     TWS_ACTIVE, TWS_WAITING);
            if(TWS_WAITING == dwPrevState)
            {
                return true;
            }
        }
        else
        {
            return true;
        }
        return false;
    }